

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

vector_type * __thiscall
Disa::Vector_Dense<double,2ul>::operator-=
          (Vector_Dense<double,2ul> *this,Vector_Dense<double,_2UL> *vector)

{
  unsigned_long index;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(double *)(this + lVar1 * 8) =
         *(double *)(this + lVar1 * 8) - (vector->super_array<double,_2UL>)._M_elems[lVar1];
  }
  return (vector_type *)this;
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(_size == vector.size(),
                 "Incompatible vector sizes, " + std::to_string(_size) + " vs. " + std::to_string(vector.size()) + ".");
    FOR(index, _size)(*this)[index] -= vector[index];
    return *this;
  }